

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

STBase * __thiscall jbcoin::STObject::makeFieldPresent(STObject *this,SField *field)

{
  STBase *pSVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  STVar SStack_88;
  
  iVar2 = getFieldIndex(this,field);
  if (iVar2 == -1) {
    if (this->mType != (SOTemplate *)0x0) {
      Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
    }
    sVar3 = emplace_back<jbcoin::detail::nonPresentObject_t&,jbcoin::SField_const&>
                      (this,(nonPresentObject_t *)&detail::nonPresentObject,field);
    lVar4 = (long)(int)sVar3;
  }
  else {
    lVar4 = (long)iVar2;
    pSVar1 = (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar4].p_;
    iVar2 = (*pSVar1->_vptr_STBase[4])(pSVar1);
    if (iVar2 != 0) {
      return pSVar1;
    }
    detail::STVar::STVar(&SStack_88,pSVar1->fName);
    detail::STVar::operator=
              ((this->v_).
               super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar4,&SStack_88);
    detail::STVar::~STVar(&SStack_88);
  }
  return (this->v_).
         super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl.
         super__Vector_impl_data._M_start[lVar4].p_;
}

Assistant:

STBase* STObject::makeFieldPresent (SField const& field)
{
    int index = getFieldIndex (field);

    if (index == -1)
    {
        if (!isFree ())
            Throw<std::runtime_error> ("Field not found");

        return getPIndex (emplace_back(detail::nonPresentObject, field));
    }

    STBase* f = getPIndex (index);

    if (f->getSType () != STI_NOTPRESENT)
        return f;

    v_[index] = detail::STVar(
        detail::defaultObject, f->getFName());
    return getPIndex (index);
}